

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O3

void __thiscall ltc::set_ltc_parameters(ltc *this,vec3 *parameters)

{
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_24;
  undefined4 local_18;
  float local_14;
  undefined4 local_10;
  float local_c;
  undefined8 local_8;
  
  local_24.field_0.x = (parameters->field_0).field_0.x;
  local_14 = (parameters->field_0).field_0.y;
  if (local_24.field_0.x <= 1e-07) {
    local_24.field_0.x = 1e-07;
  }
  if (local_14 <= 1e-07) {
    local_14 = 1e-07;
  }
  local_c = (parameters->field_0).field_0.z;
  local_24._4_8_ = 0;
  local_18 = 0;
  local_10 = 0;
  local_8 = 0x3f80000000000000;
  set_ltc_matrix(this,(mat3 *)&local_24.field_0);
  return;
}

Assistant:

void ltc::set_ltc_parameters(const glm::vec3 &parameters)
{
  // Safeguard against really low parameters which will result in irreversible ltc matrix.
  float a = std::max(1e-7f, parameters.x);
  float b = std::max(1e-7f, parameters.y);
  float c = parameters.z;

  set_ltc_matrix({
    {a,    0.0f, 0.0f},
    {0.0f, b,    0.0f},
    {c,    0.0f, 1.0f}
  });
}